

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_AddItemToObject(cJSON *object,char *string,cJSON *item)

{
  uchar *string_00;
  cJSON *item_local;
  char *string_local;
  cJSON *object_local;
  
  string_00 = cJSON_strdup((uchar *)string,&global_hooks);
  cJSON_AddItemToObjectCS(object,(char *)string_00,item);
  item->type = item->type & 0xfffffdff;
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemToObject(cJSON *object, const char *string, cJSON *item)
{
    /* call cJSON_AddItemToObjectCS for code reuse */
    cJSON_AddItemToObjectCS(object, (char*)cJSON_strdup((const unsigned char*)string, &global_hooks), item);
    /* remove cJSON_StringIsConst flag */
    item->type &= ~cJSON_StringIsConst;
}